

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  uint uVar1;
  size_t dictID;
  size_t errcod;
  ZSTD_CDict *cdict_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  if ((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,ZSTDcrp_continue,zbuff);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      cctx_local = (ZSTD_CCtx *)
                   ZSTD_compress_insertDictionary
                             ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&params,
                              dict,dictSize,dictContentType,dtlm,cctx->entropyWorkspace);
      uVar1 = ERR_isError((size_t)cctx_local);
      if (uVar1 == 0) {
        cctx->dictID = (U32)cctx_local;
        cctx_local = (ZSTD_CCtx *)0x0;
      }
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)ZSTD_resetCCtx_usingCDict(cctx,cdict,params,pledgedSrcSize,zbuff);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params.cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    if (cdict && cdict->dictContentSize>0) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    CHECK_F( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     ZSTDcrp_continue, zbuff) );
    {
        size_t const dictID = ZSTD_compress_insertDictionary(
                cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                &params, dict, dictSize, dictContentType, dtlm, cctx->entropyWorkspace);
        if (ZSTD_isError(dictID)) return dictID;
        assert(dictID <= (size_t)(U32)-1);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}